

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

inetwork * create_network(void)

{
  int iVar1;
  network *this;
  
  this = (network *)operator_new(0x48);
  network::network(this);
  iVar1 = (*(this->super_inetwork)._vptr_inetwork[7])(this);
  if ((char)iVar1 == '\0') {
    (*(this->super_inetwork)._vptr_inetwork[6])(this);
    this = (network *)0x0;
  }
  return &this->super_inetwork;
}

Assistant:

inetwork* create_network()
{
    network* instance = new network();
    if (!instance->init())
    {
        instance->release();
        return NULL;
    }
    return instance;
}